

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_functional_test.cc
# Opt level: O0

void iterator_seek_test(void)

{
  void *pvVar1;
  undefined8 uVar2;
  fdb_kvs_handle *handle;
  int iVar3;
  fdb_status fVar4;
  size_t sVar5;
  fdb_doc **doc_00;
  fdb_doc *__s;
  undefined1 auStack_105a8 [7];
  fdb_iterator_seek_opt_t in_stack_fffffffffffefa5f;
  size_t in_stack_fffffffffffefa60;
  void *in_stack_fffffffffffefa68;
  fdb_iterator *in_stack_fffffffffffefa70;
  fdb_doc **in_stack_fffffffffffefad0;
  fdb_iterator *in_stack_fffffffffffefad8;
  void *pvVar6;
  undefined7 in_stack_fffffffffffff9d8;
  fdb_iterator_seek_opt_t in_stack_fffffffffffff9df;
  fdb_file_handle *in_stack_fffffffffffff9e0;
  fdb_iterator *in_stack_fffffffffffff9e8;
  fdb_iterator *in_stack_fffffffffffff9f0;
  size_t in_stack_fffffffffffffa00;
  fdb_doc **in_stack_fffffffffffffa50;
  fdb_iterator *in_stack_fffffffffffffa58;
  fdb_iterator *iterator_00;
  uint8_t *big_seek_key;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char bodybuf [256];
  char metabuf [256];
  char keybuf [256];
  fdb_iterator *local_a0;
  fdb_iterator *iterator;
  size_t *psStack_90;
  fdb_status status;
  fdb_doc *rdoc;
  fdb_doc **doc;
  fdb_kvs_handle *kv1;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  int local_60;
  int n;
  int r;
  int i;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_prev.tv_usec,(__timezone_ptr_t)0x0);
  memleak_start();
  dbfile._4_4_ = 10;
  __s = (fdb_doc *)&stack0xfffffffffffff9d8;
  psStack_90 = (size_t *)0x0;
  rdoc = __s;
  local_60 = system("rm -rf  iterator_test* > errorlog.txt");
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  fconfig.chunksize = 0;
  fconfig._2_2_ = 0;
  fconfig.blocksize = 0;
  fconfig.buffercache_size = 0x400;
  fconfig.purging_interval = 1;
  fconfig.flags._3_1_ = 0;
  fconfig.wal_threshold._4_4_ = 1;
  fdb_open((fdb_file_handle **)fconfig.encryption_key.bytes._12_8_,
           (char *)fconfig.encryption_key.bytes._4_8_,(fdb_config *)fconfig.encryption_key._0_8_);
  fdb_kvs_open_default
            (in_stack_fffffffffffff9e0,
             (fdb_kvs_handle **)CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8),
             (fdb_kvs_config *)0x107297);
  iterator._4_4_ = fdb_set_log_callback(kv1,logCallbackFunc,"iterator_seek_test");
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x209);
    iterator_seek_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x209,"void iterator_seek_test()");
    }
  }
  iterator._4_4_ =
       fdb_kvs_open((fdb_file_handle *)fconfig.compaction_minimum_filesize,
                    (fdb_kvs_handle **)fconfig._40_8_,
                    (char *)CONCAT17(fconfig.flags._3_1_,fconfig._32_7_),
                    (fdb_kvs_config *)CONCAT44(fconfig.purging_interval,fconfig._24_4_));
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x20d);
    iterator_seek_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x20d,"void iterator_seek_test()");
    }
  }
  for (n = 0; n < dbfile._4_4_; n = n + 1) {
    sprintf(metabuf + 0xf8,"kEy%d",(ulong)(uint)n);
    sprintf(bodybuf + 0xf8,"mEta%d",(ulong)(uint)n);
    sprintf((char *)&fconfig.num_blocks_readahead,"bOdy%d",(ulong)(uint)n);
    strlen(metabuf + 0xf8);
    strlen(bodybuf + 0xf8);
    pvVar6 = (void *)0x107468;
    sVar5 = strlen((char *)&fconfig.num_blocks_readahead);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,
                   CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8),pvVar6,sVar5,
                   (void *)0x10749f,in_stack_fffffffffffffa00);
    iterator._4_4_ = fdb_set((fdb_kvs_handle *)doc,(fdb_doc *)(&rdoc->keylen)[n]);
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x217);
      iterator_seek_test::__test_pass = 0;
      if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0x217,"void iterator_seek_test()");
      }
    }
    fdb_doc_free((fdb_doc *)0x107532);
  }
  for (n = 1; n < dbfile._4_4_; n = n + 2) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
    sprintf((char *)&fconfig.num_blocks_readahead,"body%d",(ulong)(uint)n);
    strlen(metabuf + 0xf8);
    strlen(bodybuf + 0xf8);
    pvVar6 = (void *)0x10760d;
    sVar5 = strlen((char *)&fconfig.num_blocks_readahead);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,
                   CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8),pvVar6,sVar5,
                   (void *)0x107644,in_stack_fffffffffffffa00);
    fdb_set(kv1,(fdb_doc *)(&rdoc->keylen)[n]);
  }
  fdb_commit((fdb_file_handle *)CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8),'\0');
  for (n = 0; n < dbfile._4_4_; n = n + 2) {
    sprintf(metabuf + 0xf8,"key%d",(ulong)(uint)n);
    sprintf(bodybuf + 0xf8,"meta%d",(ulong)(uint)n);
    sprintf((char *)&fconfig.num_blocks_readahead,"body%d",(ulong)(uint)n);
    strlen(metabuf + 0xf8);
    strlen(bodybuf + 0xf8);
    pvVar6 = (void *)0x107746;
    sVar5 = strlen((char *)&fconfig.num_blocks_readahead);
    fdb_doc_create((fdb_doc **)in_stack_fffffffffffff9e8,in_stack_fffffffffffff9e0,
                   CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8),pvVar6,sVar5,
                   (void *)0x10777d,in_stack_fffffffffffffa00);
    fdb_set(kv1,(fdb_doc *)(&rdoc->keylen)[n]);
  }
  fdb_commit((fdb_file_handle *)CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8),'\0');
  fdb_iterator_init(kv1,&local_a0,(void *)0x0,0,(void *)0x0,0,0);
  iterator._4_4_ = fdb_iterator_get(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x23a);
    iterator_seek_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x23a,"void iterator_seek_test()");
    }
  }
  iVar3 = memcmp((void *)psStack_90[4],*(void **)(rdoc->keylen + 0x20),*psStack_90);
  if (iVar3 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)(rdoc->keylen + 0x20),psStack_90[4],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x23c);
    iterator_seek_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x23c,"void iterator_seek_test()");
  }
  iVar3 = memcmp((void *)psStack_90[7],*(void **)(rdoc->keylen + 0x38),psStack_90[1]);
  if (iVar3 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)(rdoc->keylen + 0x38),psStack_90[7],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x23d);
    iterator_seek_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x23d,"void iterator_seek_test()");
  }
  iVar3 = memcmp((void *)psStack_90[8],*(void **)(rdoc->keylen + 0x40),psStack_90[2]);
  if (iVar3 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)(rdoc->keylen + 0x40),psStack_90[8],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x23e);
    iterator_seek_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x23e,"void iterator_seek_test()");
  }
  fdb_doc_free((fdb_doc *)0x107a12);
  psStack_90 = (size_t *)0x0;
  n = 2;
  strlen(metabuf + 0xf8);
  iterator._4_4_ =
       fdb_iterator_seek(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,
                         (size_t)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9df);
  if (iterator._4_4_ == FDB_RESULT_ITERATOR_FAIL) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x245);
    iterator_seek_test::__test_pass = 0;
    if (iterator._4_4_ == FDB_RESULT_ITERATOR_FAIL) {
      __assert_fail("status != FDB_RESULT_ITERATOR_FAIL",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x245,"void iterator_seek_test()");
    }
  }
  iterator._4_4_ = fdb_iterator_get(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x247);
    iterator_seek_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x247,"void iterator_seek_test()");
    }
  }
  iVar3 = memcmp((void *)psStack_90[4],*(void **)((&rdoc->keylen)[n] + 0x20),*psStack_90);
  if (iVar3 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)((&rdoc->keylen)[n] + 0x20),psStack_90[4],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x249);
    iterator_seek_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x249,"void iterator_seek_test()");
  }
  iVar3 = memcmp((void *)psStack_90[7],*(void **)((&rdoc->keylen)[n] + 0x38),psStack_90[1]);
  if (iVar3 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)((&rdoc->keylen)[n] + 0x38),psStack_90[7],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x24a);
    iterator_seek_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x24a,"void iterator_seek_test()");
  }
  iVar3 = memcmp((void *)psStack_90[8],*(void **)((&rdoc->keylen)[n] + 0x40),psStack_90[2]);
  if (iVar3 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)((&rdoc->keylen)[n] + 0x40),psStack_90[8],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x24b);
    iterator_seek_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x24b,"void iterator_seek_test()");
  }
  fdb_doc_free((fdb_doc *)0x107d28);
  psStack_90 = (size_t *)0x0;
  iterator._4_4_ =
       fdb_iterator_next((fdb_iterator *)
                         CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8));
  if (iterator._4_4_ == FDB_RESULT_ITERATOR_FAIL) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x251);
    iterator_seek_test::__test_pass = 0;
    if (iterator._4_4_ == FDB_RESULT_ITERATOR_FAIL) {
      __assert_fail("status != FDB_RESULT_ITERATOR_FAIL",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x251,"void iterator_seek_test()");
    }
  }
  iterator._4_4_ = fdb_iterator_get(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x253);
    iterator_seek_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x253,"void iterator_seek_test()");
    }
  }
  n = n + 1;
  iVar3 = memcmp((void *)psStack_90[4],*(void **)((&rdoc->keylen)[n] + 0x20),*psStack_90);
  if (iVar3 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)((&rdoc->keylen)[n] + 0x20),psStack_90[4],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x256);
    iterator_seek_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x256,"void iterator_seek_test()");
  }
  iVar3 = memcmp((void *)psStack_90[7],*(void **)((&rdoc->keylen)[n] + 0x38),psStack_90[1]);
  if (iVar3 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)((&rdoc->keylen)[n] + 0x38),psStack_90[7],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,599);
    iterator_seek_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,599,"void iterator_seek_test()");
  }
  iVar3 = memcmp((void *)psStack_90[8],*(void **)((&rdoc->keylen)[n] + 0x40),psStack_90[2]);
  if (iVar3 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)((&rdoc->keylen)[n] + 0x40),psStack_90[8],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,600);
    iterator_seek_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,600,"void iterator_seek_test()");
  }
  fdb_doc_free((fdb_doc *)0x108003);
  psStack_90 = (size_t *)0x0;
  strlen(metabuf + 0xf8);
  iterator._4_4_ =
       fdb_iterator_seek(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,
                         (size_t)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9df);
  if (iterator._4_4_ == FDB_RESULT_ITERATOR_FAIL) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x25e);
    iterator_seek_test::__test_pass = 0;
    if (iterator._4_4_ == FDB_RESULT_ITERATOR_FAIL) {
      __assert_fail("status != FDB_RESULT_ITERATOR_FAIL",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x25e,"void iterator_seek_test()");
    }
  }
  iterator._4_4_ = fdb_iterator_get(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x260);
    iterator_seek_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x260,"void iterator_seek_test()");
    }
  }
  iVar3 = memcmp((void *)psStack_90[4],*(void **)((&rdoc->keylen)[dbfile._4_4_ + -1] + 0x20),
                 *psStack_90);
  if (iVar3 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)((&rdoc->keylen)[dbfile._4_4_ + -1] + 0x20),psStack_90[4],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x262);
    iterator_seek_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x262,"void iterator_seek_test()");
  }
  iVar3 = memcmp((void *)psStack_90[7],*(void **)((&rdoc->keylen)[dbfile._4_4_ + -1] + 0x38),
                 psStack_90[1]);
  if (iVar3 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)((&rdoc->keylen)[dbfile._4_4_ + -1] + 0x38),psStack_90[7],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x263);
    iterator_seek_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x263,"void iterator_seek_test()");
  }
  iVar3 = memcmp((void *)psStack_90[8],*(void **)((&rdoc->keylen)[dbfile._4_4_ + -1] + 0x40),
                 psStack_90[2]);
  if (iVar3 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)((&rdoc->keylen)[dbfile._4_4_ + -1] + 0x40),psStack_90[8],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x264);
    iterator_seek_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x264,"void iterator_seek_test()");
  }
  fdb_doc_free((fdb_doc *)0x108335);
  psStack_90 = (size_t *)0x0;
  n = 0;
  strlen(metabuf + 0xf8);
  iterator._4_4_ =
       fdb_iterator_seek(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,
                         (size_t)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9df);
  if (iterator._4_4_ == FDB_RESULT_ITERATOR_FAIL) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x26b);
    iterator_seek_test::__test_pass = 0;
    if (iterator._4_4_ == FDB_RESULT_ITERATOR_FAIL) {
      __assert_fail("status != FDB_RESULT_ITERATOR_FAIL",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x26b,"void iterator_seek_test()");
    }
  }
  iterator._4_4_ = fdb_iterator_get(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x26d);
    iterator_seek_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x26d,"void iterator_seek_test()");
    }
  }
  iVar3 = memcmp((void *)psStack_90[4],*(void **)((&rdoc->keylen)[n] + 0x20),*psStack_90);
  if (iVar3 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)((&rdoc->keylen)[n] + 0x20),psStack_90[4],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x26f);
    iterator_seek_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x26f,"void iterator_seek_test()");
  }
  iVar3 = memcmp((void *)psStack_90[7],*(void **)((&rdoc->keylen)[n] + 0x38),psStack_90[1]);
  if (iVar3 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)((&rdoc->keylen)[n] + 0x38),psStack_90[7],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x270);
    iterator_seek_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x270,"void iterator_seek_test()");
  }
  iVar3 = memcmp((void *)psStack_90[8],*(void **)((&rdoc->keylen)[n] + 0x40),psStack_90[2]);
  if (iVar3 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)((&rdoc->keylen)[n] + 0x40),psStack_90[8],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x271);
    iterator_seek_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x271,"void iterator_seek_test()");
  }
  fdb_doc_free((fdb_doc *)0x10864b);
  psStack_90 = (size_t *)0x0;
  strlen(metabuf + 0xf8);
  iterator._4_4_ =
       fdb_iterator_seek(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,
                         (size_t)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9df);
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x277);
    iterator_seek_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x277,"void iterator_seek_test()");
    }
  }
  n = 2;
  do {
    iterator._4_4_ = fdb_iterator_get(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x27c);
      iterator_seek_test::__test_pass = 0;
      if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0x27c,"void iterator_seek_test()");
      }
    }
    iVar3 = memcmp((void *)psStack_90[4],*(void **)((&rdoc->keylen)[n] + 0x20),*psStack_90);
    if (iVar3 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
              *(undefined8 *)((&rdoc->keylen)[n] + 0x20),psStack_90[4],
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x27e);
      iterator_seek_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x27e,"void iterator_seek_test()");
    }
    iVar3 = memcmp((void *)psStack_90[7],*(void **)((&rdoc->keylen)[n] + 0x38),psStack_90[1]);
    if (iVar3 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
              *(undefined8 *)((&rdoc->keylen)[n] + 0x38),psStack_90[7],
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x27f);
      iterator_seek_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x27f,"void iterator_seek_test()");
    }
    iVar3 = memcmp((void *)psStack_90[8],*(void **)((&rdoc->keylen)[n] + 0x40),psStack_90[2]);
    if (iVar3 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
              *(undefined8 *)((&rdoc->keylen)[n] + 0x40),psStack_90[8],
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x280);
      iterator_seek_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x280,"void iterator_seek_test()");
    }
    fdb_doc_free((fdb_doc *)0x10895d);
    psStack_90 = (size_t *)0x0;
    n = n + 1;
    fVar4 = fdb_iterator_next((fdb_iterator *)
                              CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8));
  } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
  if (n != 10) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x286);
    iterator_seek_test::__test_pass = 0;
    if (n != 10) {
      __assert_fail("i==10",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x286,"void iterator_seek_test()");
    }
  }
  strlen(metabuf + 0xf8);
  iterator._4_4_ =
       fdb_iterator_seek(in_stack_fffffffffffff9f0,in_stack_fffffffffffff9e8,
                         (size_t)in_stack_fffffffffffff9e0,in_stack_fffffffffffff9df);
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x28a);
    iterator_seek_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x28a,"void iterator_seek_test()");
    }
  }
  n = 3;
  do {
    iterator._4_4_ = fdb_iterator_get(in_stack_fffffffffffffa58,in_stack_fffffffffffffa50);
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x28f);
      iterator_seek_test::__test_pass = 0;
      if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0x28f,"void iterator_seek_test()");
      }
    }
    iVar3 = memcmp((void *)psStack_90[4],*(void **)((&rdoc->keylen)[n] + 0x20),*psStack_90);
    if (iVar3 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
              *(undefined8 *)((&rdoc->keylen)[n] + 0x20),psStack_90[4],
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x291);
      iterator_seek_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x291,"void iterator_seek_test()");
    }
    iVar3 = memcmp((void *)psStack_90[7],*(void **)((&rdoc->keylen)[n] + 0x38),psStack_90[1]);
    if (iVar3 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
              *(undefined8 *)((&rdoc->keylen)[n] + 0x38),psStack_90[7],
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x292);
      iterator_seek_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x292,"void iterator_seek_test()");
    }
    iVar3 = memcmp((void *)psStack_90[8],*(void **)((&rdoc->keylen)[n] + 0x40),psStack_90[2]);
    if (iVar3 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
              *(undefined8 *)((&rdoc->keylen)[n] + 0x40),psStack_90[8],
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x293);
      iterator_seek_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x293,"void iterator_seek_test()");
    }
    fdb_doc_free((fdb_doc *)0x108cea);
    psStack_90 = (size_t *)0x0;
    n = n + 1;
    fVar4 = fdb_iterator_next((fdb_iterator *)
                              CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8));
  } while (fVar4 != FDB_RESULT_ITERATOR_FAIL);
  if (n != 10) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x299);
    iterator_seek_test::__test_pass = 0;
    if (n != 10) {
      __assert_fail("i==10",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x299,"void iterator_seek_test()");
    }
  }
  fdb_iterator_close(in_stack_fffffffffffff9e8);
  sprintf(metabuf + 0xf8,"key%d",4);
  sprintf(bodybuf + 0xf8,"key%d",8);
  handle = kv1;
  doc_00 = (fdb_doc **)strlen(metabuf + 0xf8);
  iterator_00 = (fdb_iterator *)(bodybuf + 0xf8);
  sVar5 = strlen(bodybuf + 0xf8);
  iterator._4_4_ =
       fdb_iterator_init(handle,&local_a0,metabuf + 0xf8,(size_t)doc_00,iterator_00,sVar5,2);
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2a4);
    iterator_seek_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x2a4,"void iterator_seek_test()");
    }
  }
  n = 8;
  iterator._4_4_ =
       fdb_iterator_seek_to_max
                 ((fdb_iterator *)CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8));
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2a7);
    iterator_seek_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x2a7,"void iterator_seek_test()");
    }
  }
  iterator._4_4_ = fdb_iterator_get(iterator_00,doc_00);
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2a9);
    iterator_seek_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x2a9,"void iterator_seek_test()");
    }
  }
  iVar3 = memcmp((void *)psStack_90[4],*(void **)((&rdoc->keylen)[n] + 0x20),*psStack_90);
  if (iVar3 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)((&rdoc->keylen)[n] + 0x20),psStack_90[4],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2ab);
    iterator_seek_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x2ab,"void iterator_seek_test()");
  }
  iVar3 = memcmp((void *)psStack_90[7],*(void **)((&rdoc->keylen)[n] + 0x38),psStack_90[1]);
  if (iVar3 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)((&rdoc->keylen)[n] + 0x38),psStack_90[7],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2ac);
    iterator_seek_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x2ac,"void iterator_seek_test()");
  }
  iVar3 = memcmp((void *)psStack_90[8],*(void **)((&rdoc->keylen)[n] + 0x40),psStack_90[2]);
  if (iVar3 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)((&rdoc->keylen)[n] + 0x40),psStack_90[8],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2ad);
    iterator_seek_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x2ad,"void iterator_seek_test()");
  }
  fdb_doc_free((fdb_doc *)0x109167);
  psStack_90 = (size_t *)0x0;
  n = 4;
  iterator._4_4_ =
       fdb_iterator_seek_to_min
                 ((fdb_iterator *)CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8));
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2b4);
    iterator_seek_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x2b4,"void iterator_seek_test()");
    }
  }
  iterator._4_4_ = fdb_iterator_get(iterator_00,doc_00);
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2b6);
    iterator_seek_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x2b6,"void iterator_seek_test()");
    }
  }
  iVar3 = memcmp((void *)psStack_90[4],*(void **)((&rdoc->keylen)[n] + 0x20),*psStack_90);
  if (iVar3 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)((&rdoc->keylen)[n] + 0x20),psStack_90[4],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2b8);
    iterator_seek_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x2b8,"void iterator_seek_test()");
  }
  iVar3 = memcmp((void *)psStack_90[7],*(void **)((&rdoc->keylen)[n] + 0x38),psStack_90[1]);
  if (iVar3 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)((&rdoc->keylen)[n] + 0x38),psStack_90[7],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2b9);
    iterator_seek_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x2b9,"void iterator_seek_test()");
  }
  iVar3 = memcmp((void *)psStack_90[8],*(void **)((&rdoc->keylen)[n] + 0x40),psStack_90[2]);
  if (iVar3 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)((&rdoc->keylen)[n] + 0x40),psStack_90[8],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2ba);
    iterator_seek_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x2ba,"void iterator_seek_test()");
  }
  fdb_doc_free((fdb_doc *)0x109440);
  psStack_90 = (size_t *)0x0;
  iterator._4_4_ = fdb_iterator_close(in_stack_fffffffffffff9e8);
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2bf);
    iterator_seek_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x2bf,"void iterator_seek_test()");
    }
  }
  iterator._4_4_ = fdb_iterator_init(kv1,&local_a0,(void *)0x0,0,(void *)0x0,0,0);
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2c3);
    iterator_seek_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x2c3,"void iterator_seek_test()");
    }
  }
  n = dbfile._4_4_ + -1;
  iterator._4_4_ =
       fdb_iterator_seek_to_max
                 ((fdb_iterator *)CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8));
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2c7);
    iterator_seek_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x2c7,"void iterator_seek_test()");
    }
  }
  iterator._4_4_ = fdb_iterator_get(iterator_00,doc_00);
  if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2c9);
    iterator_seek_test::__test_pass = 0;
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x2c9,"void iterator_seek_test()");
    }
  }
  iVar3 = memcmp((void *)psStack_90[4],*(void **)((&rdoc->keylen)[n] + 0x20),*psStack_90);
  if (iVar3 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)((&rdoc->keylen)[n] + 0x20),psStack_90[4],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2cb);
    iterator_seek_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x2cb,"void iterator_seek_test()");
  }
  iVar3 = memcmp((void *)psStack_90[7],*(void **)((&rdoc->keylen)[n] + 0x38),psStack_90[1]);
  if (iVar3 != 0) {
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
            *(undefined8 *)((&rdoc->keylen)[n] + 0x38),psStack_90[7],
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x2cc);
    iterator_seek_test::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x2cc,"void iterator_seek_test()");
  }
  iVar3 = memcmp((void *)psStack_90[8],*(void **)((&rdoc->keylen)[n] + 0x40),psStack_90[2]);
  if (iVar3 == 0) {
    fdb_doc_free((fdb_doc *)0x109828);
    psStack_90 = (size_t *)0x0;
    n = 0;
    iterator._4_4_ =
         fdb_iterator_seek_to_min
                   ((fdb_iterator *)CONCAT17(in_stack_fffffffffffff9df,in_stack_fffffffffffff9d8));
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x2d4);
      iterator_seek_test::__test_pass = 0;
      if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0x2d4,"void iterator_seek_test()");
      }
    }
    iterator._4_4_ = fdb_iterator_get(iterator_00,doc_00);
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x2d6);
      iterator_seek_test::__test_pass = 0;
      if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0x2d6,"void iterator_seek_test()");
      }
    }
    iVar3 = memcmp((void *)psStack_90[4],*(void **)((&rdoc->keylen)[n] + 0x20),*psStack_90);
    if (iVar3 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
              *(undefined8 *)((&rdoc->keylen)[n] + 0x20),psStack_90[4],
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x2d8);
      iterator_seek_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x2d8,"void iterator_seek_test()");
    }
    iVar3 = memcmp((void *)psStack_90[7],*(void **)((&rdoc->keylen)[n] + 0x38),psStack_90[1]);
    if (iVar3 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
              *(undefined8 *)((&rdoc->keylen)[n] + 0x38),psStack_90[7],
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x2d9);
      iterator_seek_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x2d9,"void iterator_seek_test()");
    }
    iVar3 = memcmp((void *)psStack_90[8],*(void **)((&rdoc->keylen)[n] + 0x40),psStack_90[2]);
    if (iVar3 != 0) {
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
              *(undefined8 *)((&rdoc->keylen)[n] + 0x40),psStack_90[8],
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x2da);
      iterator_seek_test::__test_pass = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x2da,"void iterator_seek_test()");
    }
    fdb_doc_free((fdb_doc *)0x109b01);
    psStack_90 = (size_t *)0x0;
    if (iterator._4_4_ == FDB_RESULT_SUCCESS) {
      __s = (fdb_doc *)auStack_105a8;
      memset(__s,0xff,0xff80);
      iterator._4_4_ =
           fdb_iterator_seek(in_stack_fffffffffffefa70,in_stack_fffffffffffefa68,
                             in_stack_fffffffffffefa60,in_stack_fffffffffffefa5f);
      if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0x2e4);
        iterator_seek_test::__test_pass = 0;
        if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                        ,0x2e4,"void iterator_seek_test()");
        }
      }
      n = dbfile._4_4_ + -1;
      iterator._4_4_ = fdb_iterator_get(in_stack_fffffffffffefad8,in_stack_fffffffffffefad0);
      if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0x2e7);
        iterator_seek_test::__test_pass = 0;
        if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                        ,0x2e7,"void iterator_seek_test()");
        }
      }
      iVar3 = memcmp((void *)psStack_90[4],*(void **)((&rdoc->keylen)[n] + 0x20),*psStack_90);
      if (iVar3 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                *(undefined8 *)((&rdoc->keylen)[n] + 0x20),psStack_90[4],
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0x2e9);
        iterator_seek_test::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0x2e9,"void iterator_seek_test()");
      }
      iVar3 = memcmp((void *)psStack_90[7],*(void **)((&rdoc->keylen)[n] + 0x38),psStack_90[1]);
      if (iVar3 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                *(undefined8 *)((&rdoc->keylen)[n] + 0x38),psStack_90[7],
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0x2ea);
        iterator_seek_test::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0x2ea,"void iterator_seek_test()");
      }
      iVar3 = memcmp((void *)psStack_90[8],*(void **)((&rdoc->keylen)[n] + 0x40),psStack_90[2]);
      if (iVar3 != 0) {
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
                *(undefined8 *)((&rdoc->keylen)[n] + 0x40),psStack_90[8],
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0x2eb);
        iterator_seek_test::__test_pass = 0;
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0x2eb,"void iterator_seek_test()");
      }
      fdb_doc_free((fdb_doc *)0x109e23);
      psStack_90 = (size_t *)0x0;
    }
    psStack_90 = (size_t *)0x0;
    __s[-1].deleted = true;
    *(undefined3 *)&__s[-1].field_0x49 = 0x109e;
    __s[-1].flags = 0;
    iterator._4_4_ = fdb_iterator_close((fdb_iterator *)__s->bodylen);
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __s[-1].deleted = true;
      *(undefined3 *)&__s[-1].field_0x49 = 0x109e;
      __s[-1].flags = 0;
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x2f1);
      iterator_seek_test::__test_pass = 0;
      if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
        __s[-1].deleted = true;
        *(undefined3 *)&__s[-1].field_0x49 = 0x109e;
        __s[-1].flags = 0;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0x2f1,"void iterator_seek_test()");
      }
    }
    for (n = 0; n < dbfile._4_4_; n = n + 2) {
      __s[-1].deleted = true;
      *(undefined3 *)&__s[-1].field_0x49 = 0x109e;
      __s[-1].flags = 0;
      iterator._4_4_ = fdb_del((fdb_kvs_handle *)__s[1].bodylen,(fdb_doc *)__s[1].metalen);
      if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
        __s[-1].deleted = true;
        *(undefined3 *)&__s[-1].field_0x49 = 0x109e;
        __s[-1].flags = 0;
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0x2f6);
        iterator_seek_test::__test_pass = 0;
        if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
          __s[-1].deleted = true;
          *(undefined3 *)&__s[-1].field_0x49 = 0x109f;
          __s[-1].flags = 0;
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                        ,0x2f6,"void iterator_seek_test()");
        }
      }
    }
    __s[-1].deleted = true;
    *(undefined3 *)&__s[-1].field_0x49 = 0x109f;
    __s[-1].flags = 0;
    fdb_commit((fdb_file_handle *)__s->keylen,*(fdb_commit_opt_t *)((long)&__s[-1].flags + 3));
    *(undefined4 *)&__s[-1].body = 0;
    __s[-1].meta = (void *)0x109f7a;
    fdb_iterator_init(kv1,&local_a0,(void *)0x0,0,(void *)0x0,0,*(fdb_iterator_opt_t *)&__s[-1].body
                     );
    psStack_90 = (size_t *)0x0;
    n = 2;
    __s[-1].deleted = true;
    *(undefined3 *)&__s[-1].field_0x49 = 0x109f;
    __s[-1].flags = 0;
    strlen(metabuf + 0xf8);
    __s[-1].deleted = true;
    *(undefined3 *)&__s[-1].field_0x49 = 0x109f;
    __s[-1].flags = 0;
    iterator._4_4_ =
         fdb_iterator_seek((fdb_iterator *)__s->size_ondisk,(void *)__s->bodylen,__s->metalen,
                           *(fdb_iterator_seek_opt_t *)((long)&__s->keylen + 7));
    if (iterator._4_4_ == FDB_RESULT_ITERATOR_FAIL) {
      __s[-1].deleted = true;
      *(undefined3 *)&__s[-1].field_0x49 = 0x10a0;
      __s[-1].flags = 0;
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x302);
      iterator_seek_test::__test_pass = 0;
      if (iterator._4_4_ == FDB_RESULT_ITERATOR_FAIL) {
        __s[-1].deleted = true;
        *(undefined3 *)&__s[-1].field_0x49 = 0x10a0;
        __s[-1].flags = 0;
        __assert_fail("status != FDB_RESULT_ITERATOR_FAIL",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0x302,"void iterator_seek_test()");
      }
    }
    __s[-1].deleted = true;
    *(undefined3 *)&__s[-1].field_0x49 = 0x10a0;
    __s[-1].flags = 0;
    iterator._4_4_ = fdb_iterator_get((fdb_iterator *)__s[1].offset,(fdb_doc **)__s[1].seqnum);
    if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
      __s[-1].deleted = true;
      *(undefined3 *)&__s[-1].field_0x49 = 0x10a0;
      __s[-1].flags = 0;
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x304);
      iterator_seek_test::__test_pass = 0;
      if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
        __s[-1].deleted = true;
        *(undefined3 *)&__s[-1].field_0x49 = 0x10a0;
        __s[-1].flags = 0;
        __assert_fail("status == FDB_RESULT_SUCCESS",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                      ,0x304,"void iterator_seek_test()");
      }
    }
    pvVar6 = (void *)psStack_90[4];
    pvVar1 = *(void **)((&rdoc->keylen)[n] + 0x20);
    sVar5 = *psStack_90;
    __s[-1].deleted = true;
    *(undefined3 *)&__s[-1].field_0x49 = 0x10a0;
    __s[-1].flags = 0;
    iVar3 = memcmp(pvVar6,pvVar1,sVar5);
    if (iVar3 != 0) {
      uVar2 = *(undefined8 *)((&rdoc->keylen)[n] + 0x20);
      sVar5 = psStack_90[4];
      __s[-1].deleted = true;
      *(undefined3 *)&__s[-1].field_0x49 = 0x10a1;
      __s[-1].flags = 0;
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",uVar2,sVar5,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x306);
      iterator_seek_test::__test_pass = 0;
      __s[-1].deleted = true;
      *(undefined3 *)&__s[-1].field_0x49 = 0x10a1;
      __s[-1].flags = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x306,"void iterator_seek_test()");
    }
    pvVar6 = (void *)psStack_90[7];
    pvVar1 = *(void **)((&rdoc->keylen)[n] + 0x38);
    sVar5 = psStack_90[1];
    __s[-1].deleted = true;
    *(undefined3 *)&__s[-1].field_0x49 = 0x10a1;
    __s[-1].flags = 0;
    iVar3 = memcmp(pvVar6,pvVar1,sVar5);
    if (iVar3 != 0) {
      uVar2 = *(undefined8 *)((&rdoc->keylen)[n] + 0x38);
      sVar5 = psStack_90[7];
      __s[-1].deleted = true;
      *(undefined3 *)&__s[-1].field_0x49 = 0x10a1;
      __s[-1].flags = 0;
      fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",uVar2,sVar5,
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
              ,0x307);
      iterator_seek_test::__test_pass = 0;
      __s[-1].deleted = true;
      *(undefined3 *)&__s[-1].field_0x49 = 0x10a1;
      __s[-1].flags = 0;
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                    ,0x307,"void iterator_seek_test()");
    }
    pvVar6 = (void *)psStack_90[8];
    pvVar1 = *(void **)((&rdoc->keylen)[n] + 0x40);
    sVar5 = psStack_90[2];
    __s[-1].deleted = true;
    *(undefined3 *)&__s[-1].field_0x49 = 0x10a2;
    __s[-1].flags = 0;
    iVar3 = memcmp(pvVar6,pvVar1,sVar5);
    if (iVar3 == 0) {
      __s[-1].deleted = true;
      *(undefined3 *)&__s[-1].field_0x49 = 0x10a2;
      __s[-1].flags = 0;
      fdb_doc_free(*(fdb_doc **)&__s[-1].deleted);
      psStack_90 = (size_t *)0x0;
      __s[-1].deleted = true;
      *(undefined3 *)&__s[-1].field_0x49 = 0x10a2;
      __s[-1].flags = 0;
      iterator._4_4_ = fdb_iterator_close((fdb_iterator *)__s->bodylen);
      if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
        __s[-1].deleted = true;
        *(undefined3 *)&__s[-1].field_0x49 = 0x10a2;
        __s[-1].flags = 0;
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0x30d);
        iterator_seek_test::__test_pass = 0;
        if (iterator._4_4_ != FDB_RESULT_SUCCESS) {
          __s[-1].deleted = true;
          *(undefined3 *)&__s[-1].field_0x49 = 0x10a3;
          __s[-1].flags = 0;
          __assert_fail("status == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                        ,0x30d,"void iterator_seek_test()");
        }
      }
      __s[-1].deleted = true;
      *(undefined3 *)&__s[-1].field_0x49 = 0x10a3;
      __s[-1].flags = 0;
      fdb_kvs_close((fdb_kvs_handle *)__s->keylen);
      __s[-1].deleted = true;
      *(undefined3 *)&__s[-1].field_0x49 = 0x10a3;
      __s[-1].flags = 0;
      fdb_kvs_close((fdb_kvs_handle *)__s->keylen);
      __s[-1].deleted = true;
      *(undefined3 *)&__s[-1].field_0x49 = 0x10a3;
      __s[-1].flags = 0;
      fdb_close((fdb_file_handle *)__s->keylen);
      for (n = 0; n < dbfile._4_4_; n = n + 1) {
        __s[-1].deleted = true;
        *(undefined3 *)&__s[-1].field_0x49 = 0x10a3;
        __s[-1].flags = 0;
        fdb_doc_free(*(fdb_doc **)&__s[-1].deleted);
      }
      __s[-1].deleted = true;
      *(undefined3 *)&__s[-1].field_0x49 = 0x10a3;
      __s[-1].flags = 0;
      fdb_shutdown();
      __s[-1].deleted = true;
      *(undefined3 *)&__s[-1].field_0x49 = 0x10a3;
      __s[-1].flags = 0;
      memleak_end();
      if (iterator_seek_test::__test_pass == 0) {
        __s[-1].deleted = true;
        *(undefined3 *)&__s[-1].field_0x49 = 0x10a3;
        __s[-1].flags = 0;
        fprintf(_stderr,"%s FAILED\n","iterator seek test");
      }
      else {
        __s[-1].deleted = true;
        *(undefined3 *)&__s[-1].field_0x49 = 0x10a3;
        __s[-1].flags = 0;
        fprintf(_stderr,"%s PASSED\n","iterator seek test");
      }
      return;
    }
    uVar2 = *(undefined8 *)((&rdoc->keylen)[n] + 0x40);
    sVar5 = psStack_90[8];
    __s[-1].deleted = true;
    *(undefined3 *)&__s[-1].field_0x49 = 0x10a2;
    __s[-1].flags = 0;
    fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",uVar2,sVar5,
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
            ,0x308);
    iterator_seek_test::__test_pass = 0;
    __s[-1].deleted = true;
    *(undefined3 *)&__s[-1].field_0x49 = 0x10a2;
    __s[-1].flags = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                  ,0x308,"void iterator_seek_test()");
  }
  fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",
          *(undefined8 *)((&rdoc->keylen)[n] + 0x40),psStack_90[8],
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
          ,0x2cd);
  iterator_seek_test::__test_pass = 0;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/iterator_functional_test.cc"
                ,0x2cd,"void iterator_seek_test()");
}

Assistant:

void iterator_seek_test()
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 10;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db, *kv1;
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_doc *rdoc = NULL;
    fdb_status status;
    fdb_iterator *iterator;

    char keybuf[256], metabuf[256], bodybuf[256];

    // remove previous iterator_test files
    r = system(SHELL_DEL" iterator_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.purging_interval = 1; // retain deletes before compaction

    // open db
    fdb_open(&dbfile, "./iterator_test1", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);
    status = fdb_set_log_callback(db, logCallbackFunc,
                                  (void *) "iterator_seek_test");
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Create another KV store..
    status = fdb_kvs_open(dbfile, &kv1, "kv1", &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert using 'kv1' instance to ensure it does not interfere
    for (i=0;i<n;++i){
        sprintf(keybuf, "kEy%d", i);
        sprintf(metabuf, "mEta%d", i);
        sprintf(bodybuf, "bOdy%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        status = fdb_set(kv1, doc[i]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_doc_free(doc[i]);
    }

    // insert documents of odd number into the main (default) KV store handle
    for (i=1;i<n;i+=2){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }
    // manually flush WAL & commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents of even number
    for (i=0;i<n;i+=2){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        fdb_set(db, doc[i]);
    }
    // commit without WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // now odd number docs are in hb-trie & even number docs are in WAL

    // create an iterator for full range
    fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);

    // seek current iterator to inside the WAL's avl tree..
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[0]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[0]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[0]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // seek forward to 2nd key ..
    i=2;
    status = fdb_iterator_seek(iterator, doc[i]->key, strlen(keybuf), 0);
    TEST_CHK(status != FDB_RESULT_ITERATOR_FAIL);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // iterator should be able to proceed forward
    status = fdb_iterator_next(iterator);
    TEST_CHK(status != FDB_RESULT_ITERATOR_FAIL);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    i++;
    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // seek forward to the last key.
    status = fdb_iterator_seek(iterator, doc[n-1]->key, strlen(keybuf), 0);
    TEST_CHK(status != FDB_RESULT_ITERATOR_FAIL);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[n-1]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[n-1]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[n-1]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // seek backward to start key ..
    i = 0;
    status = fdb_iterator_seek(iterator, doc[i]->key, strlen(keybuf), 0);
    TEST_CHK(status != FDB_RESULT_ITERATOR_FAIL);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // seek forward to key2 ..
    status = fdb_iterator_seek(iterator, doc[2]->key, strlen(keybuf), 0);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    i=2;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        fdb_doc_free(rdoc);
        rdoc = NULL;
        i++;
    } while(fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(i==10);

    // Seek backward again to a key in the trie...
    status = fdb_iterator_seek(iterator, doc[3]->key, strlen(keybuf), 0);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    i=3;
    do {
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);

        fdb_doc_free(rdoc);
        rdoc = NULL;
        i++;
    } while (fdb_iterator_next(iterator) != FDB_RESULT_ITERATOR_FAIL);
    TEST_CHK(i==10);

    fdb_iterator_close(iterator);

    // Test fdb_iterator_seek_to_max with key range
    // create an iterator for range of doc[4] ~ doc[8]
    sprintf(keybuf, "key%d", 4); // reuse buffer for start key
    sprintf(metabuf, "key%d", 8); // reuse buffer for end_key
    status = fdb_iterator_init(db, &iterator, keybuf, strlen(keybuf),
                      metabuf, strlen(metabuf),
                      FDB_ITR_NO_DELETES);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    i = 8;
    status = fdb_iterator_seek_to_max(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // test fdb_iterator_seek_to_min
    i = 4;
    status = fdb_iterator_seek_to_min(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    status = fdb_iterator_close(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Test fdb_iterator_seek_to_max over full range
    status = fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    i = n - 1;
    status = fdb_iterator_seek_to_max(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // test fdb_iterator_seek_to_min
    i = 0;
    status = fdb_iterator_seek_to_min(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    // seek to max using a non-existent FFFF key
    if (status == FDB_RESULT_SUCCESS) {
        uint8_t *big_seek_key = alca(uint8_t, FDB_MAX_KEYLEN);
        memset(big_seek_key, 0xff, FDB_MAX_KEYLEN);
        status = fdb_iterator_seek(iterator, big_seek_key, FDB_MAX_KEYLEN,
                                   FDB_ITR_SEEK_LOWER);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        i = n - 1;
        status = fdb_iterator_get(iterator, &rdoc);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
        TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
        TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
        fdb_doc_free(rdoc);
        rdoc = NULL;
    }

    status = fdb_iterator_close(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // delete documents of even number so WAL only has deleted docs
    for (i=0;i<n;i+=2){
        status = fdb_del(db, doc[i]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }
    // commit without WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // create an iterator for full range
    fdb_iterator_init(db, &iterator, NULL, 0, NULL, 0, FDB_ITR_NONE);

    // seek forward to 2nd key ..
    rdoc = NULL;
    i=2;
    status = fdb_iterator_seek(iterator, doc[i]->key, strlen(keybuf), 0);
    TEST_CHK(status != FDB_RESULT_ITERATOR_FAIL);
    status = fdb_iterator_get(iterator, &rdoc);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    TEST_CMP(rdoc->key, doc[i]->key, rdoc->keylen);
    TEST_CMP(rdoc->meta, doc[i]->meta, rdoc->metalen);
    TEST_CMP(rdoc->body, doc[i]->body, rdoc->bodylen);
    fdb_doc_free(rdoc);
    rdoc = NULL;

    status = fdb_iterator_close(iterator);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close the kvs kv1
    fdb_kvs_close(kv1);
    // close db file
    fdb_kvs_close(db);
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    TEST_RESULT("iterator seek test");
}